

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_avx2.c
# Opt level: O0

void perform_convolve_for_4hx2v_2x2_blocks
               (float *input_ptr,int in_stride,__m256 *weight,__m256 *out_accum,
               __m256i shuffle_output_mask)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [24];
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  float *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  undefined1 (*in_RDI) [24];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  __m256 load_src [4];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  
  auVar4 = *in_RDI;
  puVar5 = (undefined8 *)(*in_RDI + (long)in_ESI * 4);
  puVar6 = (undefined8 *)(*in_RDI + (long)(in_ESI << 1) * 4);
  puVar7 = (undefined8 *)(*in_RDI + (long)(in_ESI * 3) * 4);
  local_160 = auVar4._0_4_;
  fStack_15c = auVar4._4_4_;
  fStack_158 = auVar4._8_4_;
  fStack_154 = auVar4._12_4_;
  fStack_150 = auVar4._16_4_;
  fStack_14c = auVar4._20_4_;
  fStack_148 = (float)*(undefined8 *)in_RDI[1];
  fStack_144 = (float)((ulong)*(undefined8 *)in_RDI[1] >> 0x20);
  local_180 = (float)*in_RDX;
  fStack_17c = (float)((ulong)*in_RDX >> 0x20);
  fStack_178 = (float)in_RDX[1];
  fStack_174 = (float)((ulong)in_RDX[1] >> 0x20);
  fStack_170 = (float)in_RDX[2];
  fStack_16c = (float)((ulong)in_RDX[2] >> 0x20);
  fStack_168 = (float)in_RDX[3];
  local_1a0 = (float)*puVar5;
  fStack_19c = (float)((ulong)*puVar5 >> 0x20);
  fStack_198 = (float)puVar5[1];
  fStack_194 = (float)((ulong)puVar5[1] >> 0x20);
  fStack_190 = (float)puVar5[2];
  fStack_18c = (float)((ulong)puVar5[2] >> 0x20);
  fStack_188 = (float)puVar5[3];
  fStack_184 = (float)((ulong)puVar5[3] >> 0x20);
  local_1c0 = (float)in_RDX[4];
  fStack_1bc = (float)((ulong)in_RDX[4] >> 0x20);
  fStack_1b8 = (float)in_RDX[5];
  fStack_1b4 = (float)((ulong)in_RDX[5] >> 0x20);
  fStack_1b0 = (float)in_RDX[6];
  fStack_1ac = (float)((ulong)in_RDX[6] >> 0x20);
  fStack_1a8 = (float)in_RDX[7];
  local_1e0 = (float)*puVar6;
  fStack_1dc = (float)((ulong)*puVar6 >> 0x20);
  fStack_1d8 = (float)puVar6[1];
  fStack_1d4 = (float)((ulong)puVar6[1] >> 0x20);
  fStack_1d0 = (float)puVar6[2];
  fStack_1cc = (float)((ulong)puVar6[2] >> 0x20);
  fStack_1c8 = (float)puVar6[3];
  fStack_1c4 = (float)((ulong)puVar6[3] >> 0x20);
  local_200 = (float)*in_RDX;
  fStack_1fc = (float)((ulong)*in_RDX >> 0x20);
  fStack_1f8 = (float)in_RDX[1];
  fStack_1f4 = (float)((ulong)in_RDX[1] >> 0x20);
  fStack_1f0 = (float)in_RDX[2];
  fStack_1ec = (float)((ulong)in_RDX[2] >> 0x20);
  fStack_1e8 = (float)in_RDX[3];
  local_220 = (float)*puVar7;
  fStack_21c = (float)((ulong)*puVar7 >> 0x20);
  fStack_218 = (float)puVar7[1];
  fStack_214 = (float)((ulong)puVar7[1] >> 0x20);
  fStack_210 = (float)puVar7[2];
  fStack_20c = (float)((ulong)puVar7[2] >> 0x20);
  fStack_208 = (float)puVar7[3];
  fStack_204 = (float)((ulong)puVar7[3] >> 0x20);
  local_240 = (float)in_RDX[4];
  fStack_23c = (float)((ulong)in_RDX[4] >> 0x20);
  fStack_238 = (float)in_RDX[5];
  fStack_234 = (float)((ulong)in_RDX[5] >> 0x20);
  fStack_230 = (float)in_RDX[6];
  fStack_22c = (float)((ulong)in_RDX[6] >> 0x20);
  fStack_228 = (float)in_RDX[7];
  local_360._4_4_ = fStack_15c * fStack_17c + fStack_19c * fStack_1bc;
  local_360._0_4_ = local_160 * local_180 + local_1a0 * local_1c0;
  fStack_358 = fStack_158 * fStack_178 + fStack_198 * fStack_1b8;
  fStack_354 = fStack_154 * fStack_174 + fStack_194 * fStack_1b4;
  uStack_350._0_4_ = fStack_150 * fStack_170 + fStack_190 * fStack_1b0;
  uStack_350._4_4_ = fStack_14c * fStack_16c + fStack_18c * fStack_1ac;
  uStack_348._0_4_ = fStack_148 * fStack_168 + fStack_188 * fStack_1a8;
  uStack_348._4_4_ = fStack_144 + fStack_184;
  auVar1 = _local_360;
  local_320 = CONCAT44(fStack_1dc * fStack_1fc + fStack_21c * fStack_23c,
                       local_1e0 * local_200 + local_220 * local_240);
  uStack_318 = CONCAT44(fStack_1d4 * fStack_1f4 + fStack_214 * fStack_234,
                        fStack_1d8 * fStack_1f8 + fStack_218 * fStack_238);
  uStack_310 = CONCAT44(fStack_1cc * fStack_1ec + fStack_20c * fStack_22c,
                        fStack_1d0 * fStack_1f0 + fStack_210 * fStack_230);
  uStack_308 = CONCAT44(fStack_1c4 + fStack_204,fStack_1c8 * fStack_1e8 + fStack_208 * fStack_228);
  uStack_348 = auVar1._24_8_;
  auVar3._16_8_ = uStack_350;
  auVar3._0_16_ = _local_360;
  auVar3._24_8_ = uStack_348;
  auVar1._8_8_ = uStack_318;
  auVar1._0_8_ = local_320;
  auVar1._16_8_ = uStack_310;
  auVar1._24_8_ = uStack_308;
  auVar1 = vhaddps_avx(auVar3,auVar1);
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar2._16_8_ = in_YMM0_H;
  auVar2._24_8_ = in_register_00001218;
  auVar1 = vpermps_avx2(auVar2,auVar1);
  local_120 = (float)*(undefined8 *)in_RCX;
  fStack_11c = (float)((ulong)*(undefined8 *)in_RCX >> 0x20);
  fStack_118 = (float)*(undefined8 *)(in_RCX + 2);
  fStack_114 = (float)((ulong)*(undefined8 *)(in_RCX + 2) >> 0x20);
  fStack_110 = (float)*(undefined8 *)(in_RCX + 4);
  fStack_10c = (float)((ulong)*(undefined8 *)(in_RCX + 4) >> 0x20);
  fStack_108 = (float)*(undefined8 *)(in_RCX + 6);
  fStack_104 = (float)((ulong)*(undefined8 *)(in_RCX + 6) >> 0x20);
  local_140 = auVar1._0_4_;
  fStack_13c = auVar1._4_4_;
  fStack_138 = auVar1._8_4_;
  fStack_134 = auVar1._12_4_;
  fStack_130 = auVar1._16_4_;
  fStack_12c = auVar1._20_4_;
  fStack_128 = auVar1._24_4_;
  fStack_124 = auVar1._28_4_;
  *in_RCX = local_120 + local_140;
  in_RCX[1] = fStack_11c + fStack_13c;
  in_RCX[2] = fStack_118 + fStack_138;
  in_RCX[3] = fStack_114 + fStack_134;
  in_RCX[4] = fStack_110 + fStack_130;
  in_RCX[5] = fStack_10c + fStack_12c;
  in_RCX[6] = fStack_108 + fStack_128;
  in_RCX[7] = fStack_104 + fStack_124;
  return;
}

Assistant:

static inline void perform_convolve_for_4hx2v_2x2_blocks(
    const float *input_ptr, int in_stride, __m256 *weight, __m256 *out_accum,
    __m256i shuffle_output_mask) {
  __m256 load_src[4];
  // Load input into source registers.
  load_src[0] = _mm256_loadu_ps(input_ptr);
  load_src[1] = _mm256_loadu_ps(input_ptr + in_stride);
  load_src[2] = _mm256_loadu_ps(input_ptr + (in_stride * 2));
  load_src[3] = _mm256_loadu_ps(input_ptr + (in_stride * 3));

  // Multiply the loaded input with corresponding weights.
  load_src[0] = _mm256_mul_ps(load_src[0], weight[0]);
  load_src[1] = _mm256_mul_ps(load_src[1], weight[1]);
  load_src[2] = _mm256_mul_ps(load_src[2], weight[0]);
  load_src[3] = _mm256_mul_ps(load_src[3], weight[1]);

  // Accumulate across 2x2 blocks.
  load_src[0] = _mm256_add_ps(load_src[0], load_src[1]);
  load_src[2] = _mm256_add_ps(load_src[2], load_src[3]);
  load_src[0] = _mm256_hadd_ps(load_src[0], load_src[2]);

  // Sort the output in order to store into output buffer.
  load_src[0] = _mm256_permutevar8x32_ps(load_src[0], shuffle_output_mask);
  *out_accum = _mm256_add_ps(*out_accum, load_src[0]);
}